

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

void * xmlIOHTTPOpenW(char *post_uri,int compression)

{
  uint uVar1;
  int iVar2;
  xmlIOHTTPWriteCtxtPtr ctxt;
  xmlChar *pxVar3;
  xmlOutputBufferPtr __s;
  xmlOutputCloseCallback p_Var4;
  xmlOutputWriteCallback p_Var5;
  char *msg;
  char *extra;
  xmlChar axStack_228 [504];
  
  extra = (char *)axStack_228;
  if (post_uri == (char *)0x0) {
    return (void *)0x0;
  }
  ctxt = (xmlIOHTTPWriteCtxtPtr)(*xmlMalloc)(0x18);
  if (ctxt == (xmlIOHTTPWriteCtxtPtr)0x0) {
    __xmlSimpleError(8,2,(xmlNodePtr)0x0,(char *)0x0,"creating HTTP output context");
    return (void *)0x0;
  }
  *(undefined8 *)ctxt = 0;
  ctxt->uri = (char *)0x0;
  ctxt->doc_buff = (void *)0x0;
  pxVar3 = xmlStrdup((xmlChar *)post_uri);
  ctxt->uri = (char *)pxVar3;
  if (pxVar3 == (xmlChar *)0x0) {
    __xmlSimpleError(8,2,(xmlNodePtr)0x0,(char *)0x0,"copying URI");
    goto LAB_001986e9;
  }
  if (compression - 1U < 9) {
    ctxt->compression = compression;
    __s = (xmlOutputBufferPtr)(*xmlMalloc)(0x88);
    if (__s == (xmlOutputBufferPtr)0x0) {
      extra = "creating buffer context";
LAB_001986ca:
      iVar2 = 2;
      msg = (char *)0x0;
    }
    else {
      memset(__s,0,0x88);
      __s->context = (void *)0x8000;
      p_Var4 = (xmlOutputCloseCallback)(*xmlMalloc)(0x8000);
      __s->closecallback = p_Var4;
      if (p_Var4 == (xmlOutputCloseCallback)0x0) {
        (*xmlFree)((void *)0x0);
        deflateEnd(&__s->encoder);
        (*xmlFree)(__s);
        extra = "creating buffer";
        goto LAB_001986ca;
      }
      uVar1 = deflateInit2_(&__s->encoder,compression,8,0xfffffff1,8,0,"1.2.11",0x70);
      if (uVar1 == 0) {
        p_Var5 = (xmlOutputWriteCallback)crc32(0,0,0);
        __s->writecallback = p_Var5;
        iVar2 = snprintf((char *)__s->closecallback,(size_t)__s->context,"%c%c%c%c%c%c%c%c%c%c",0x1f
                         ,0x8b,8,0,0,0,0,0,0,3);
        *(xmlOutputCloseCallback *)&__s->written = __s->closecallback + iVar2;
        *(int *)&__s[1].context = *(int *)&__s->context - iVar2;
        goto LAB_001986e0;
      }
      (*xmlFree)(__s->closecallback);
      deflateEnd(&__s->encoder);
      (*xmlFree)(__s);
      xmlStrPrintf(axStack_228,500,"xmlCreateZMemBuff:  %s %d\n",
                   "Error initializing compression context.  ZLIB error:",(ulong)uVar1);
      msg = "write error";
      iVar2 = 0x60a;
    }
    __s = (xmlOutputBufferPtr)0x0;
    __xmlSimpleError(8,iVar2,(xmlNodePtr)0x0,msg,extra);
  }
  else {
    __s = xmlAllocOutputBufferInternal((xmlCharEncodingHandlerPtr)0x0);
  }
LAB_001986e0:
  ctxt->doc_buff = __s;
  if (__s != (xmlOutputBufferPtr)0x0) {
    return ctxt;
  }
LAB_001986e9:
  xmlFreeHTTPWriteCtxt(ctxt);
  return (void *)0x0;
}

Assistant:

void *
xmlIOHTTPOpenW(const char *post_uri, int compression ATTRIBUTE_UNUSED)
{

    xmlIOHTTPWriteCtxtPtr ctxt = NULL;

    if (post_uri == NULL)
        return (NULL);

    ctxt = xmlMalloc(sizeof(xmlIOHTTPWriteCtxt));
    if (ctxt == NULL) {
	xmlIOErrMemory("creating HTTP output context");
        return (NULL);
    }

    (void) memset(ctxt, 0, sizeof(xmlIOHTTPWriteCtxt));

    ctxt->uri = (char *) xmlStrdup((const xmlChar *)post_uri);
    if (ctxt->uri == NULL) {
	xmlIOErrMemory("copying URI");
        xmlFreeHTTPWriteCtxt(ctxt);
        return (NULL);
    }

    /*
     * **  Since the document length is required for an HTTP post,
     * **  need to put the document into a buffer.  A memory buffer
     * **  is being used to avoid pushing the data to disk and back.
     */

#ifdef LIBXML_ZLIB_ENABLED
    if ((compression > 0) && (compression <= 9)) {

        ctxt->compression = compression;
        ctxt->doc_buff = xmlCreateZMemBuff(compression);
    } else
#endif
    {
        /*  Any character conversions should have been done before this  */

        ctxt->doc_buff = xmlAllocOutputBufferInternal(NULL);
    }

    if (ctxt->doc_buff == NULL) {
        xmlFreeHTTPWriteCtxt(ctxt);
        ctxt = NULL;
    }

    return (ctxt);
}